

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::LoadRevisions(cmCTestGIT *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  ostream *poVar1;
  cmUVProcessChainBuilder *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_598;
  vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_> local_548;
  undefined1 local_530 [8];
  OutputLogger err;
  CommitParser out;
  undefined1 local_338 [8];
  cmUVProcessChainBuilder builder;
  string local_2b8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_291;
  undefined1 local_290;
  allocator<char> local_28f;
  allocator<char> local_28e;
  allocator<char> local_28d;
  allocator<char> local_28c;
  allocator<char> local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  iterator local_180;
  size_type local_178;
  undefined1 local_170 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_diff_tree;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  iterator local_a8;
  size_type local_a0;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_list;
  string git;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string range;
  cmCTestGIT *this_local;
  
  range.field_2._8_8_ = this;
  std::operator+(&local_50,&(this->super_cmCTestGlobalVC).OldRevision,"..");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,&(this->super_cmCTestGlobalVC).NewRevision);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string
            ((string *)
             &git_rev_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  git_diff_tree.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  std::__cxx11::string::string
            ((string *)&local_148,
             (string *)
             &git_rev_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"rev-list",
             (allocator<char> *)
             ((long)&git_diff_tree.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"--reverse",
             (allocator<char> *)
             ((long)&git_diff_tree.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::__cxx11::string::string(local_e8,(string *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"--",
             (allocator<char> *)
             ((long)&git_diff_tree.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  git_diff_tree.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  local_a8 = &local_148;
  local_a0 = 5;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&git_diff_tree.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l_00._M_len = local_a0;
  __l_00._M_array = local_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_98,__l_00,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&git_diff_tree.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  local_598 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8;
  do {
    local_598 = local_598 + -1;
    std::__cxx11::string::~string((string *)local_598);
  } while (local_598 != &local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&git_diff_tree.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&git_diff_tree.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&git_diff_tree.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_290 = 1;
  local_288 = &local_280;
  std::__cxx11::string::string
            ((string *)local_288,
             (string *)
             &git_rev_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_260,"diff-tree",&local_289);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_240,"--stdin",&local_28a);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"--always",&local_28b);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"-z",&local_28c);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"-r",&local_28d);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"--pretty=raw",&local_28e);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"--encoding=utf-8",&local_28f);
  local_290 = 0;
  local_180 = &local_280;
  local_178 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_291);
  __l._M_len = local_178;
  __l._M_array = local_180;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_170,__l,&local_291);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_291);
  local_628 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180;
  do {
    local_628 = local_628 + -1;
    std::__cxx11::string::~string((string *)local_628);
  } while (local_628 != &local_280);
  std::allocator<char>::~allocator(&local_28f);
  std::allocator<char>::~allocator(&local_28e);
  std::allocator<char>::~allocator(&local_28d);
  std::allocator<char>::~allocator(&local_28c);
  std::allocator<char>::~allocator(&local_28b);
  std::allocator<char>::~allocator(&local_28a);
  std::allocator<char>::~allocator(&local_289);
  poVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  cmCTestVC::ComputeCommandLine
            (&local_2b8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b8);
  poVar1 = std::operator<<(poVar1," | ");
  cmCTestVC::ComputeCommandLine
            ((string *)&builder.Loop,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_170);
  poVar1 = std::operator<<(poVar1,(string *)&builder.Loop);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&builder.Loop);
  std::__cxx11::string::~string((string *)&local_2b8);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_338);
  pcVar2 = cmUVProcessChainBuilder::AddCommand
                     ((cmUVProcessChainBuilder *)local_338,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_98);
  pcVar2 = cmUVProcessChainBuilder::AddCommand
                     (pcVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_170);
  std::__cxx11::string::string
            ((string *)(out.Rev.Log.field_2._M_local_buf + 8),
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory);
  cmUVProcessChainBuilder::SetWorkingDirectory(pcVar2,(string *)((long)&out.Rev.Log.field_2 + 8));
  std::__cxx11::string::~string((string *)(out.Rev.Log.field_2._M_local_buf + 8));
  CommitParser::CommitParser((CommitParser *)&err.super_LineParser.Separator,this,"dt-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_530,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"dt-err> ")
  ;
  cmProcessTools::RunProcess
            (&local_548,(cmUVProcessChainBuilder *)local_338,
             (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_530,UTF8);
  std::vector<cmUVProcessChain::Status,_std::allocator<cmUVProcessChain::Status>_>::~vector
            (&local_548);
  cmProcessTools::OutputParser::Process((OutputParser *)&err.super_LineParser.Separator,"",1);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_530);
  CommitParser::~CommitParser((CommitParser *)&err.super_LineParser.Separator);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  std::__cxx11::string::~string
            ((string *)
             &git_rev_list.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_30);
  return true;
}

Assistant:

bool cmCTestGIT::LoadRevisions()
{
  // Use 'git rev-list ... | git diff-tree ...' to get revisions.
  std::string range = this->OldRevision + ".." + this->NewRevision;
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_list = { git, "rev-list", "--reverse",
                                            range, "--" };
  std::vector<std::string> git_diff_tree = {
    git,  "diff-tree", "--stdin",      "--always",
    "-z", "-r",        "--pretty=raw", "--encoding=utf-8"
  };
  this->Log << cmCTestGIT::ComputeCommandLine(git_rev_list) << " | "
            << cmCTestGIT::ComputeCommandLine(git_diff_tree) << "\n";

  cmUVProcessChainBuilder builder;
  builder.AddCommand(git_rev_list)
    .AddCommand(git_diff_tree)
    .SetWorkingDirectory(this->SourceDirectory);

  CommitParser out(this, "dt-out> ");
  OutputLogger err(this->Log, "dt-err> ");
  cmCTestGIT::RunProcess(builder, &out, &err, cmProcessOutput::UTF8);

  // Send one extra zero-byte to terminate the last record.
  out.Process("", 1);

  return true;
}